

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

ElementDocument * __thiscall Rml::Context::LoadDocument(Context *this,String *document_path)

{
  bool bVar1;
  pointer pSVar2;
  ElementDocument *document;
  unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_> local_28;
  UniquePtr<Rml::StreamFile> stream;
  String *document_path_local;
  Context *this_local;
  
  stream._M_t.super___uniq_ptr_impl<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>._M_t.
  super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>.
  super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl =
       (__uniq_ptr_data<Rml::StreamFile,_std::default_delete<Rml::StreamFile>,_true,_true>)
       (__uniq_ptr_data<Rml::StreamFile,_std::default_delete<Rml::StreamFile>,_true,_true>)
       document_path;
  MakeUnique<Rml::StreamFile>();
  pSVar2 = ::std::unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>::operator->
                     (&local_28);
  bVar1 = StreamFile::Open(pSVar2,(String *)
                                  stream._M_t.
                                  super___uniq_ptr_impl<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Rml::StreamFile_*,_std::default_delete<Rml::StreamFile>_>
                                  .super__Head_base<0UL,_Rml::StreamFile_*,_false>._M_head_impl);
  if (bVar1) {
    pSVar2 = ::std::unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>::get
                       (&local_28);
    this_local = (Context *)LoadDocument(this,&pSVar2->super_Stream);
  }
  else {
    this_local = (Context *)0x0;
  }
  ::std::unique_ptr<Rml::StreamFile,_std::default_delete<Rml::StreamFile>_>::~unique_ptr(&local_28);
  return (ElementDocument *)this_local;
}

Assistant:

ElementDocument* Context::LoadDocument(const String& document_path)
{
	auto stream = MakeUnique<StreamFile>();

	if (!stream->Open(document_path))
		return nullptr;

	ElementDocument* document = LoadDocument(stream.get());

	return document;
}